

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

int xmlSwitchInputEncodingName(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,char *encoding)

{
  xmlParserErrors xVar1;
  xmlCharEncodingHandlerPtr in_RAX;
  int iVar2;
  xmlCharEncodingHandlerPtr handler;
  
  iVar2 = -1;
  if (encoding != (char *)0x0) {
    handler = in_RAX;
    xVar1 = xmlCreateCharEncodingHandler
                      (encoding,XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&handler);
    if (xVar1 == XML_ERR_OK) {
      xVar1 = xmlInputSetEncodingHandler(input,handler);
      if (xVar1 == XML_ERR_OK) {
        iVar2 = 0;
      }
      else {
        xmlCtxtErrIO(ctxt,xVar1,(char *)0x0);
      }
    }
    else if (xVar1 == XML_ERR_UNSUPPORTED_ENCODING) {
      xmlWarningMsg(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding: %s\n",
                    (xmlChar *)encoding,(xmlChar *)0x0);
    }
    else {
      xmlFatalErr(ctxt,xVar1,encoding);
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSwitchInputEncodingName(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                           const char *encoding) {
    xmlCharEncodingHandlerPtr handler;
    xmlParserErrors res;

    if (encoding == NULL)
        return(-1);

    res = xmlCreateCharEncodingHandler(encoding, XML_ENC_INPUT,
            ctxt->convImpl, ctxt->convCtxt, &handler);
    if (res == XML_ERR_UNSUPPORTED_ENCODING) {
        xmlWarningMsg(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
                      "Unsupported encoding: %s\n", BAD_CAST encoding, NULL);
        return(-1);
    } else if (res != XML_ERR_OK) {
        xmlFatalErr(ctxt, res, encoding);
        return(-1);
    }

    res  = xmlInputSetEncodingHandler(input, handler);
    if (res != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, res, NULL);
        return(-1);
    }

    return(0);
}